

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ctr.c
# Opt level: O0

void beltCTRStepE(void *buf,size_t count,void *state)

{
  u32 uVar1;
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_ctr_st *st;
  ulong local_10;
  ulong *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x10) != 0) {
    if (in_RSI <= *(ulong *)(in_RDX + 0x10)) {
      memXor2(in_RDI,(void *)((long)in_RDX + (0x40 - *(long *)(in_RDX + 0x10))),in_RSI);
      *(ulong *)(in_RDX + 0x10) = *(long *)(in_RDX + 0x10) - in_RSI;
      return;
    }
    memXor2(in_RDI,(void *)((long)in_RDX + (0x40 - *(long *)(in_RDX + 0x10))),
            *(size_t *)(in_RDX + 0x10));
    local_10 = in_RSI - *(long *)(in_RDX + 0x10);
    local_8 = (ulong *)((long)in_RDI + *(long *)(in_RDX + 0x10));
    in_RDX[0x10] = 0;
    in_RDX[0x11] = 0;
  }
  for (; 0xf < local_10; local_10 = local_10 - 0x10) {
    uVar1 = in_RDX[8];
    in_RDX[8] = uVar1 + 1;
    if (((uVar1 + 1 == 0) && (uVar1 = in_RDX[9], in_RDX[9] = uVar1 + 1, uVar1 + 1 == 0)) &&
       (uVar1 = in_RDX[10], in_RDX[10] = uVar1 + 1, uVar1 + 1 == 0)) {
      in_RDX[0xb] = in_RDX[0xb] + 1;
    }
    *(undefined8 *)(in_RDX + 0xc) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)(in_RDX + 0xe) = *(undefined8 *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 0xc,in_RDX);
    *local_8 = *(ulong *)(in_RDX + 0xc) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 0xe) ^ local_8[1];
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    uVar1 = in_RDX[8];
    in_RDX[8] = uVar1 + 1;
    if (((uVar1 + 1 == 0) && (uVar1 = in_RDX[9], in_RDX[9] = uVar1 + 1, uVar1 + 1 == 0)) &&
       (uVar1 = in_RDX[10], in_RDX[10] = uVar1 + 1, uVar1 + 1 == 0)) {
      in_RDX[0xb] = in_RDX[0xb] + 1;
    }
    *(undefined8 *)(in_RDX + 0xc) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)(in_RDX + 0xe) = *(undefined8 *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 0xc,in_RDX);
    memXor2(local_8,in_RDX + 0xc,local_10);
    *(ulong *)(in_RDX + 0x10) = 0x10 - local_10;
  }
  return;
}

Assistant:

void beltCTRStepE(void* buf, size_t count, void* state)
{
	belt_ctr_st* st = (belt_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCTR_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block + 16 - st->reserved, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block + 16 - st->reserved, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockIncU32(st->ctr);
		beltBlockCopy(st->block, st->ctr);
		beltBlockEncr2((u32*)st->block, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockIncU32(st->ctr);
		beltBlockCopy(st->block, st->ctr);
		beltBlockEncr2((u32*)st->block, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		memXor2(buf, st->block, count);
		st->reserved = 16 - count;
	}
}